

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O3

bool __thiscall
vkt::synchronization::anon_unknown_0::MultiQueues::getFreeQueue
          (MultiQueues *this,deUint32 *returnQueueFamilyIndex,VkQueue *returnQueues,
          int *returnQueueIndex)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  deUint32 *pdVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  int index;
  ulong uVar6;
  
  index = 0;
  if (0 < (int)(this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    do {
      pdVar3 = getQueueFamilyIndex((MultiQueues *)
                                   (this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left,index);
      pmVar4 = std::
               map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType>_>_>
               ::operator[](&this->m_queues,pdVar3);
      if (0 < (int)((ulong)((long)(pmVar4->queues).
                                  super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar4->queues).
                                 super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        uVar6 = 0;
        do {
          deMutex_lock((this->m_mutex).m_mutex);
          p_Var1 = (pmVar4->available).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar5 = uVar6 >> 6 & 0x3ffffff;
          uVar2 = p_Var1[uVar5];
          if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
            p_Var1[uVar5] = uVar2 & ~(1L << ((byte)uVar6 & 0x3f));
            pdVar3 = getQueueFamilyIndex((MultiQueues *)
                                         (this->m_queues)._M_t._M_impl.super__Rb_tree_header.
                                         _M_header._M_left,index);
            *returnQueueFamilyIndex = *pdVar3;
            *returnQueues =
                 (pmVar4->queues).
                 super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
            *returnQueueIndex = (int)uVar6;
            index = 1;
            deMutex_unlock((this->m_mutex).m_mutex);
            goto LAB_007c67a6;
          }
          deMutex_unlock((this->m_mutex).m_mutex);
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 <
                 (long)(int)((ulong)((long)(pmVar4->queues).
                                           super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pmVar4->queues).
                                          super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      index = index + 1;
    } while (index < (int)(this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    index = 0;
  }
LAB_007c67a6:
  return SUB41(index,0);
}

Assistant:

bool			getFreeQueue			(deUint32& returnQueueFamilyIndex, VkQueue& returnQueues, int& returnQueueIndex)
	{
		for (int queueFamilyIndexNdx = 0 ; queueFamilyIndexNdx < static_cast<int>(m_queues.size()); ++queueFamilyIndexNdx)
		{
			Queues& queue = m_queues[getQueueFamilyIndex(queueFamilyIndexNdx)];
			for (int queueNdx = 0; queueNdx < static_cast<int>(queue.queues.size()); ++queueNdx)
			{
				m_mutex.lock();
				if (queue.available[queueNdx])
				{
					queue.available[queueNdx]	= false;
					returnQueueFamilyIndex		= getQueueFamilyIndex(queueFamilyIndexNdx);
					returnQueues				= queue.queues[queueNdx];
					returnQueueIndex			= queueNdx;
					m_mutex.unlock();
					return true;
				}
				m_mutex.unlock();
			}
		}
		return false;
	}